

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte *__src;
  byte bVar1;
  int a_00;
  stbi_uc *psVar2;
  stbi__uint32 sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  stbi_uc *psVar8;
  char *pcVar9;
  void *__ptr;
  byte *pbVar10;
  long lVar11;
  byte bVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  size_t __n;
  ulong uVar16;
  ulong uVar17;
  ushort *src;
  size_t __n_00;
  ushort *puVar18;
  uint uVar19;
  stbi_uc *psVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  char cVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long in_FS_OFFSET;
  bool bVar29;
  byte local_cd;
  
  bVar29 = depth == 0x10;
  iVar5 = x * out_n << bVar29;
  a_00 = a->s->img_n;
  uVar7 = (ulong)(uint)(a_00 << bVar29);
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar29,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return 0;
  }
  iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
  if (iVar6 != 0) {
    uVar27 = a_00 * x;
    uVar28 = uVar27 * depth + 7 >> 3;
    if ((-1 < (int)y) &&
       (((y == 0 || (uVar28 <= (uint)(0x7fffffff / (ulong)y))) &&
        (uVar28 * y <= (uVar28 ^ 0x7fffffff))))) {
      if (raw_len < (uVar28 + 1) * y) {
        pcVar9 = "not enough pixels";
      }
      else {
        __ptr = malloc((ulong)(uVar28 * 2));
        if (__ptr != (void *)0x0) {
          if (y != 0) {
            sVar3 = x;
            if (depth < 8) {
              uVar7 = 1;
              sVar3 = uVar28;
            }
            iVar6 = (int)uVar7;
            uVar15 = sVar3 * iVar6;
            __n_00 = (size_t)iVar6;
            __n = (size_t)(int)uVar15;
            psVar8 = raw + __n_00 + 1;
            local_cd = 1;
            uVar23 = 0;
            uVar26 = 0;
            do {
              uVar17 = 0;
              if ((uVar26 & 1) != 0) {
                uVar17 = (ulong)uVar28;
              }
              uVar16 = (ulong)*raw;
              if (4 < uVar16) {
                *(char **)(in_FS_OFFSET + -0x20) = "invalid filter";
                free(__ptr);
                return 0;
              }
              if (uVar26 == 0) {
                uVar16 = (ulong)""[uVar16];
              }
              src = (ushort *)(uVar17 + (long)__ptr);
              psVar2 = a->out;
              __src = raw + 1;
              if ((byte)uVar16 < 6) {
                uVar17 = (ulong)((local_cd & 1) * uVar28);
                pbVar10 = (byte *)((long)__ptr + uVar17);
                switch(uVar16) {
                case 0:
                  memcpy(src,__src,__n);
                  break;
                case 1:
                  memcpy(src,__src,__n_00);
                  if (iVar6 < (int)uVar15) {
                    lVar11 = 0;
                    do {
                      *(byte *)((long)src + lVar11 + __n_00) =
                           *(byte *)((long)src + lVar11) + psVar8[lVar11];
                      lVar11 = lVar11 + 1;
                    } while ((__n_00 - __n) + lVar11 != 0);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar15) {
                    uVar17 = 0;
                    do {
                      *(byte *)((long)src + uVar17) = pbVar10[uVar17] + raw[uVar17 + 1];
                      uVar17 = uVar17 + 1;
                    } while (uVar15 != uVar17);
                  }
                  break;
                case 3:
                  if (0 < iVar6) {
                    uVar16 = 0;
                    do {
                      *(byte *)((long)src + uVar16) = (pbVar10[uVar16] >> 1) + raw[uVar16 + 1];
                      uVar16 = uVar16 + 1;
                    } while (uVar7 != uVar16);
                  }
                  if (iVar6 < (int)uVar15) {
                    pbVar10 = (byte *)((long)__ptr + uVar17 + __n_00);
                    sVar13 = __n;
                    psVar20 = psVar8;
                    puVar18 = src;
                    do {
                      *(stbi_uc *)((long)puVar18 + __n_00) =
                           (char)((uint)(byte)*puVar18 + (uint)*pbVar10 >> 1) + *psVar20;
                      puVar18 = (ushort *)((long)puVar18 + 1);
                      psVar20 = psVar20 + 1;
                      pbVar10 = pbVar10 + 1;
                      sVar13 = sVar13 - 1;
                    } while (__n_00 != sVar13);
                  }
                  break;
                case 4:
                  if (0 < iVar6) {
                    uVar17 = 0;
                    do {
                      *(byte *)((long)src + uVar17) = pbVar10[uVar17] + raw[uVar17 + 1];
                      uVar17 = uVar17 + 1;
                    } while (uVar7 != uVar17);
                  }
                  sVar13 = __n;
                  psVar20 = psVar8;
                  puVar18 = src;
                  if (iVar6 < (int)uVar15) {
                    do {
                      bVar12 = (byte)*puVar18;
                      bVar14 = pbVar10[__n_00];
                      bVar1 = *pbVar10;
                      uVar21 = (uint)bVar14;
                      uVar19 = (uint)bVar12;
                      iVar25 = (((uint)bVar1 + (uint)bVar1 * 2) - uVar21) - uVar19;
                      uVar22 = (uint)bVar14;
                      uVar4 = uVar22;
                      if (uVar19 < uVar21) {
                        uVar4 = (uint)bVar12;
                      }
                      if (uVar19 >= uVar21 && uVar19 != uVar22) {
                        uVar22 = (uint)bVar12;
                      }
                      uVar19 = (uint)bVar1;
                      if ((int)uVar22 <= iVar25) {
                        uVar19 = uVar4;
                      }
                      cVar24 = (char)uVar19;
                      if (iVar25 <= (int)uVar4) {
                        cVar24 = (char)uVar22;
                      }
                      *(stbi_uc *)((long)puVar18 + __n_00) = cVar24 + *psVar20;
                      puVar18 = (ushort *)((long)puVar18 + 1);
                      pbVar10 = pbVar10 + 1;
                      psVar20 = psVar20 + 1;
                      sVar13 = sVar13 - 1;
                    } while (__n_00 != sVar13);
                  }
                  break;
                case 5:
                  memcpy(src,__src,__n_00);
                  if (iVar6 < (int)uVar15) {
                    lVar11 = 0;
                    do {
                      *(byte *)((long)src + lVar11 + __n_00) =
                           (*(byte *)((long)src + lVar11) >> 1) + psVar8[lVar11];
                      lVar11 = lVar11 + 1;
                    } while ((__n_00 - __n) + lVar11 != 0);
                  }
                }
              }
              psVar20 = psVar2 + (uint)(iVar5 * (int)uVar26);
              if (depth < 8) {
                bVar12 = 1;
                if (color == 0) {
                  bVar12 = ""[depth];
                }
                if (depth == 4) {
                  if (uVar27 != 0) {
                    uVar17 = 0;
                    uVar16 = 0;
                    do {
                      if ((uVar17 & 1) == 0) {
                        uVar16 = (ulong)(byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar2[uVar17 + uVar23] = (char)(uVar16 >> 4) * bVar12;
                      uVar16 = (ulong)(byte)((char)uVar16 << 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar27 != (uint)uVar17);
                  }
                }
                else if (depth == 2) {
                  if (uVar27 != 0) {
                    uVar17 = 0;
                    uVar16 = 0;
                    do {
                      if ((uVar17 & 3) == 0) {
                        uVar16 = (ulong)(byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar2[uVar17 + uVar23] = (char)(uVar16 >> 6) * bVar12;
                      uVar16 = (ulong)(byte)((char)uVar16 << 2);
                      uVar17 = uVar17 + 1;
                    } while (uVar27 != (uint)uVar17);
                  }
                }
                else if (uVar27 != 0) {
                  uVar17 = 0;
                  bVar14 = 0;
                  do {
                    if ((uVar17 & 7) == 0) {
                      bVar14 = (byte)*src;
                      src = (ushort *)((long)src + 1);
                    }
                    psVar2[uVar17 + uVar23] = (char)bVar14 >> 7 & bVar12;
                    bVar14 = bVar14 * '\x02';
                    uVar17 = uVar17 + 1;
                  } while (uVar27 != (uint)uVar17);
                }
                if (a_00 != out_n) {
                  stbi__create_png_alpha_expand8(psVar20,psVar20,x,a_00);
                }
              }
              else if (depth == 8) {
                if (a_00 == out_n) {
                  memcpy(psVar20,src,(ulong)uVar27);
                }
                else {
                  stbi__create_png_alpha_expand8(psVar20,(stbi_uc *)src,x,a_00);
                }
              }
              else if (depth == 0x10) {
                if (a_00 == out_n) {
                  if (uVar27 != 0) {
                    lVar11 = 0;
                    do {
                      *(ushort *)(psVar2 + lVar11 * 2 + uVar23) =
                           src[lVar11] << 8 | src[lVar11] >> 8;
                      lVar11 = lVar11 + 1;
                    } while (uVar27 != (uint)lVar11);
                  }
                }
                else if (a_00 == 1) {
                  if (x != 0) {
                    lVar11 = 0;
                    do {
                      *(ushort *)(psVar2 + lVar11 * 4 + uVar23) =
                           src[lVar11] << 8 | src[lVar11] >> 8;
                      (psVar2 + lVar11 * 4 + uVar23 + 2)[0] = 0xff;
                      (psVar2 + lVar11 * 4 + uVar23 + 2)[1] = 0xff;
                      lVar11 = lVar11 + 1;
                    } while (x != (stbi__uint32)lVar11);
                  }
                }
                else if (x != 0) {
                  lVar11 = 0;
                  do {
                    *(ushort *)(psVar2 + lVar11 * 8 + uVar23) = *src << 8 | *src >> 8;
                    *(ushort *)(psVar2 + lVar11 * 8 + uVar23 + 2) = src[1] << 8 | src[1] >> 8;
                    *(ushort *)(psVar2 + lVar11 * 8 + uVar23 + 4) = src[2] << 8 | src[2] >> 8;
                    (psVar2 + lVar11 * 8 + uVar23 + 6)[0] = 0xff;
                    (psVar2 + lVar11 * 8 + uVar23 + 6)[1] = 0xff;
                    src = src + 3;
                    lVar11 = lVar11 + 1;
                  } while (x != (stbi__uint32)lVar11);
                }
              }
              raw = __src + __n;
              uVar26 = uVar26 + 1;
              psVar8 = psVar8 + __n + 1;
              local_cd = local_cd + 1;
              uVar23 = (ulong)(uint)((int)uVar23 + iVar5);
            } while (uVar26 != y);
          }
          free(__ptr);
          return 1;
        }
        pcVar9 = "outofmem";
      }
      goto LAB_00113b28;
    }
  }
  pcVar9 = "too large";
LAB_00113b28:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar9;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}